

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

Channel * __thiscall
ear::Layout::channelWithName(Channel *__return_storage_ptr__,Layout *this,string *name)

{
  pointer pcVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  __it;
  __normal_iterator<const_ear::Channel_*,_std::vector<ear::Channel,_std::allocator<ear::Channel>_>_>
  _Var7;
  string *local_40;
  Channel *local_38;
  
  __it._M_current =
       (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_38 = (this->_channels).super__Vector_base<ear::Channel,_std::allocator<ear::Channel>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)local_38 - (long)__it._M_current;
  lVar5 = (lVar6 >> 4) * -0x71c71c71c71c71c7 >> 2;
  local_40 = name;
  if (0 < lVar5) {
    lVar5 = lVar5 + 1;
    do {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it);
      _Var7._M_current = __it._M_current;
      if (bVar4) goto LAB_0014c6d0;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it._M_current + 1);
      _Var7._M_current = __it._M_current + 1;
      if (bVar4) goto LAB_0014c6d0;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it._M_current + 2);
      _Var7._M_current = __it._M_current + 2;
      if (bVar4) goto LAB_0014c6d0;
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
              operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                          *)&local_40,__it._M_current + 3);
      _Var7._M_current = __it._M_current + 3;
      if (bVar4) goto LAB_0014c6d0;
      __it._M_current = __it._M_current + 4;
      lVar5 = lVar5 + -1;
      lVar6 = lVar6 + -0x240;
    } while (1 < lVar5);
  }
  lVar5 = (lVar6 >> 4) * -0x71c71c71c71c71c7;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var7._M_current = local_38;
      if ((lVar5 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
                  operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                              *)&local_40,__it), _Var7._M_current = __it._M_current, bVar4))
      goto LAB_0014c6d0;
      __it._M_current = __it._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
            operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                        *)&local_40,__it);
    _Var7._M_current = __it._M_current;
    if (bVar4) goto LAB_0014c6d0;
    __it._M_current = __it._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::$_0>::
          operator()((_Iter_pred<ear::Layout::channelWithName(std::__cxx11::string_const&)const::__0>
                      *)&local_40,__it);
  _Var7._M_current = local_38;
  if (bVar4) {
    _Var7._M_current = __it._M_current;
  }
LAB_0014c6d0:
  (__return_storage_ptr__->_name)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_name).field_2;
  pcVar1 = ((_Var7._M_current)->_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + ((_Var7._M_current)->_name)._M_string_length);
  (__return_storage_ptr__->_polarPosition).distance = ((_Var7._M_current)->_polarPosition).distance;
  dVar2 = ((_Var7._M_current)->_polarPosition).elevation;
  (__return_storage_ptr__->_polarPosition).azimuth = ((_Var7._M_current)->_polarPosition).azimuth;
  (__return_storage_ptr__->_polarPosition).elevation = dVar2;
  (__return_storage_ptr__->_polarPositionNominal).super_type.m_initialized = false;
  if (((_Var7._M_current)->_polarPositionNominal).super_type.m_initialized == true) {
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_polarPositionNominal).super_type.m_storage.dummy_ + 0x10) =
         *(undefined8 *)
          ((long)&((_Var7._M_current)->_polarPositionNominal).super_type.m_storage.dummy_ + 0x10);
    uVar3 = *(undefined8 *)
             ((long)&((_Var7._M_current)->_polarPositionNominal).super_type.m_storage.dummy_ + 8);
    (__return_storage_ptr__->_polarPositionNominal).super_type.m_storage.dummy_.aligner_ =
         ((_Var7._M_current)->_polarPositionNominal).super_type.m_storage.dummy_.aligner_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_polarPositionNominal).super_type.m_storage.dummy_ + 8) =
         uVar3;
    (__return_storage_ptr__->_polarPositionNominal).super_type.m_initialized = true;
  }
  (__return_storage_ptr__->_azimuthRange).super_type.m_initialized = false;
  if (((_Var7._M_current)->_azimuthRange).super_type.m_initialized == true) {
    uVar3 = *(undefined8 *)
             ((long)&((_Var7._M_current)->_azimuthRange).super_type.m_storage.dummy_ + 8);
    (__return_storage_ptr__->_azimuthRange).super_type.m_storage.dummy_.aligner_ =
         ((_Var7._M_current)->_azimuthRange).super_type.m_storage.dummy_.aligner_;
    *(undefined8 *)((long)&(__return_storage_ptr__->_azimuthRange).super_type.m_storage.dummy_ + 8)
         = uVar3;
    (__return_storage_ptr__->_azimuthRange).super_type.m_initialized = true;
  }
  (__return_storage_ptr__->_elevationRange).super_type.m_initialized = false;
  if (((_Var7._M_current)->_elevationRange).super_type.m_initialized == true) {
    uVar3 = *(undefined8 *)
             ((long)&((_Var7._M_current)->_elevationRange).super_type.m_storage.dummy_ + 8);
    (__return_storage_ptr__->_elevationRange).super_type.m_storage.dummy_.aligner_ =
         ((_Var7._M_current)->_elevationRange).super_type.m_storage.dummy_.aligner_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->_elevationRange).super_type.m_storage.dummy_ + 8) = uVar3;
    (__return_storage_ptr__->_elevationRange).super_type.m_initialized = true;
  }
  __return_storage_ptr__->_isLfe = (_Var7._M_current)->_isLfe;
  return __return_storage_ptr__;
}

Assistant:

Channel Layout::channelWithName(const std::string& name) const {
    auto it = std::find_if(
        _channels.begin(), _channels.end(),
        [&name](const Channel c) -> bool { return c.name() == name; });
    return *it;
  }